

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void it_note_off(IT_PLAYING *playing)

{
  int *piVar1;
  int32 *piVar2;
  
  if (playing != (IT_PLAYING *)0x0) {
    playing->enabled_envelopes = playing->enabled_envelopes | 1;
    *(byte *)&playing->flags = (byte)playing->flags | 3;
    if ((~playing->sample->flags & 0x30) == 0) {
      if ((playing->resampler).dir < 0) {
        (playing->resampler).pos = ~(playing->resampler).pos + playing->sample->sus_loop_end * 2;
        piVar1 = &(playing->resampler).subpos;
        *piVar1 = *piVar1 ^ 0xffff;
        (playing->resampler).dir = 1;
      }
      piVar2 = &(playing->resampler).pos;
      *piVar2 = *piVar2 + playing->time_lost;
      playing->time_lost = 0;
    }
    it_playing_update_resamplers(playing);
    if ((playing->instrument != (IT_INSTRUMENT *)0x0) &&
       (((playing->instrument->volume_envelope).flags & 3) != 1)) {
      *(byte *)&playing->flags = (byte)playing->flags | 4;
    }
  }
  return;
}

Assistant:

static void it_note_off(IT_PLAYING *playing)
{
	if (playing) {
		playing->enabled_envelopes |= IT_ENV_VOLUME;
		playing->flags |= IT_PLAYING_BACKGROUND | IT_PLAYING_SUSTAINOFF;
		fix_sample_looping(playing);
		it_playing_update_resamplers(playing);
		if (playing->instrument)
			if ((playing->instrument->volume_envelope.flags & (IT_ENVELOPE_ON | IT_ENVELOPE_LOOP_ON)) != IT_ENVELOPE_ON)
				playing->flags |= IT_PLAYING_FADING;
	}
}